

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int client_handle_finished(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message)

{
  ptls_key_schedule_t *sched;
  long lVar1;
  long lVar2;
  ptls_iovec_t pVar3;
  uint8_t *local_d0;
  size_t local_c8;
  size_t body_size;
  size_t body_start;
  size_t capacity;
  size_t local_a0;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  ptls_message_emitter_t *_emitter;
  int local_6c;
  undefined1 local_68 [4];
  int ret;
  uint8_t send_secret [64];
  ptls_message_emitter_t *emitter_local;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  send_secret._56_8_ = emitter;
  local_6c = verify_finished(tls,message);
  if (local_6c == 0) {
    ptls__key_schedule_update_hash(tls->key_schedule,message.base,message.len);
    sched = tls->key_schedule;
    __emitter = ptls_iovec_init((void *)0x0,0);
    local_6c = key_schedule_extract(sched,__emitter);
    if ((((local_6c == 0) &&
         (local_6c = setup_traffic_protection(tls,0,"s ap traffic",3,0), local_6c == 0)) &&
        (local_6c = derive_secret(tls->key_schedule,local_68,"c ap traffic"), local_6c == 0)) &&
       (local_6c = derive_exporter_secret(tls,0), local_6c == 0)) {
      if (tls->pending_handshake_secret != (uint8_t *)0x0) {
        if (((tls->traffic_protection).enc.aead == (ptls_aead_context_t *)0x0) &&
           (tls->ctx->update_traffic_key == (ptls_update_traffic_key_t *)0x0)) {
          __assert_fail("tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/../lib/picotls.c"
                        ,0xb25,
                        "int client_handle_finished(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t)"
                       );
        }
        if ((((tls->field_20).server.pending_traffic_secret[0x28] >> 1 & 1) != 0) &&
           (((byte)tls->ctx->field_0x68 >> 4 & 1) == 0)) {
          _buf = (ptls_buffer_t *)send_secret._56_8_;
          local_6c = (**(code **)(send_secret._56_8_ + 0x18))(send_secret._56_8_);
          if (local_6c != 0) goto LAB_0012c214;
          _key_sched = (ptls_key_schedule_t *)_buf->base;
          mess_start = (size_t)tls->key_schedule;
          local_a0 = *(size_t *)_key_sched->secret;
          capacity._7_1_ = 5;
          local_6c = ptls_buffer__do_pushv
                               ((ptls_buffer_t *)_key_sched,(void *)((long)&capacity + 7),1);
          if (local_6c != 0) goto LAB_0012c214;
          body_start = 3;
          local_6c = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
          if (local_6c != 0) goto LAB_0012c214;
          lVar1 = *(long *)_key_sched->secret;
          lVar2 = *(long *)_key_sched->secret;
          for (; body_start != 0; body_start = body_start - 1) {
            *(char *)(*(long *)_key_sched + (lVar1 - body_start)) =
                 (char)((ulong)(lVar2 - lVar1) >> (((char)body_start + -1) * '\b' & 0x3fU));
          }
          if (mess_start != 0) {
            ptls__key_schedule_update_hash
                      ((ptls_key_schedule_t *)mess_start,(uint8_t *)(*(long *)_key_sched + local_a0)
                       ,*(long *)_key_sched->secret - local_a0);
          }
          local_6c = (*(code *)_buf[1].base)(_buf);
          if (local_6c != 0) goto LAB_0012c214;
        }
        local_6c = 0;
        (tls->field_20).server.pending_traffic_secret[0x28] =
             (tls->field_20).server.pending_traffic_secret[0x28] & 0xfd;
        local_6c = commission_handshake_secret(tls);
        if (local_6c != 0) goto LAB_0012c214;
      }
      local_6c = 0;
      if ((tls->field_20).client.certificate_request.context.base != (uint8_t *)0x0) {
        if (((byte)tls->field_0x160 >> 1 & 1) != 0) {
          local_6c = 0x2f;
          goto LAB_0012c214;
        }
        local_6c = send_certificate_and_certificate_verify
                             (tls,(ptls_message_emitter_t *)send_secret._56_8_,
                              &(tls->field_20).client.certificate_request.signature_algorithms,
                              (tls->field_20).client.certificate_request.context,
                              "TLS 1.3, client CertificateVerify",0);
        free((tls->field_20).client.certificate_request.context.base);
        pVar3 = ptls_iovec_init((void *)0x0,0);
        local_d0 = pVar3.base;
        (tls->field_20).client.certificate_request.context.base = local_d0;
        local_c8 = pVar3.len;
        (tls->field_20).client.certificate_request.context.len = local_c8;
        if (local_6c != 0) goto LAB_0012c214;
      }
      local_6c = push_change_cipher_spec(tls,*(ptls_buffer_t **)send_secret._56_8_);
      if (local_6c == 0) {
        local_6c = send_finished(tls,(ptls_message_emitter_t *)send_secret._56_8_);
        memcpy(&(tls->traffic_protection).enc,local_68,0x40);
        local_6c = setup_traffic_protection(tls,1,(char *)0x0,3,0);
        if (local_6c == 0) {
          tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;
        }
      }
    }
  }
LAB_0012c214:
  (*ptls_clear_memory)(local_68,0x40);
  return local_6c;
}

Assistant:

static int client_handle_finished(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message)
{
    uint8_t send_secret[PTLS_MAX_DIGEST_SIZE];
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    /* update traffic keys by using messages upto ServerFinished, but commission them after sending ClientFinished */
    if ((ret = key_schedule_extract(tls->key_schedule, ptls_iovec_init(NULL, 0))) != 0)
        goto Exit;
    if ((ret = setup_traffic_protection(tls, 0, "s ap traffic", 3, 0)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, send_secret, "c ap traffic")) != 0)
        goto Exit;
    if ((ret = derive_exporter_secret(tls, 0)) != 0)
        goto Exit;

    /* if sending early data, emit EOED and commision the client handshake traffic secret */
    if (tls->pending_handshake_secret != NULL) {
        assert(tls->traffic_protection.enc.aead != NULL || tls->ctx->update_traffic_key != NULL);
        if (tls->client.using_early_data && !tls->ctx->omit_end_of_early_data)
            ptls_push_message(emitter, tls->key_schedule, PTLS_HANDSHAKE_TYPE_END_OF_EARLY_DATA, {});
        tls->client.using_early_data = 0;
        if ((ret = commission_handshake_secret(tls)) != 0)
            goto Exit;
    }

    if (tls->client.certificate_request.context.base != NULL) {
        /* If this is a resumed session, the server must not send the certificate request in the handshake */
        if (tls->is_psk_handshake) {
            ret = PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
        ret = send_certificate_and_certificate_verify(tls, emitter, &tls->client.certificate_request.signature_algorithms,
                                                      tls->client.certificate_request.context,
                                                      PTLS_CLIENT_CERTIFICATE_VERIFY_CONTEXT_STRING, 0);
        free(tls->client.certificate_request.context.base);
        tls->client.certificate_request.context = ptls_iovec_init(NULL, 0);
        if (ret != 0)
            goto Exit;
    }

    if ((ret = push_change_cipher_spec(tls, emitter->buf)) != 0)
        goto Exit;
    ret = send_finished(tls, emitter);

    memcpy(tls->traffic_protection.enc.secret, send_secret, sizeof(send_secret));
    if ((ret = setup_traffic_protection(tls, 1, NULL, 3, 0)) != 0)
        goto Exit;

    tls->state = PTLS_STATE_CLIENT_POST_HANDSHAKE;

Exit:
    ptls_clear_memory(send_secret, sizeof(send_secret));
    return ret;
}